

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicssceneindex.cpp
# Opt level: O3

void __thiscall
QGraphicsSceneIndexPrivate::recursive_items_helper
          (QGraphicsSceneIndexPrivate *this,QGraphicsItem *item,QRectF exposeRect,
          QGraphicsSceneIndexIntersector intersect,QList<QGraphicsItem_*> *items,
          QTransform *viewTransform,ItemSelectionMode mode,qreal parentOpacity,void *intersectData)

{
  undefined1 *puVar1;
  long lVar2;
  QGraphicsItem *pQVar3;
  QRectF exposeRect_00;
  QRectF exposeRect_01;
  bool bVar4;
  QGraphicsItemPrivate *pQVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  qreal parentOpacity_00;
  QPainterPath mappedShape;
  undefined1 *local_60;
  QRectF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = (item->d_ptr).d;
  uVar7 = *(ulong *)&pQVar5->field_0x160;
  if ((uVar7 & 0x20) == 0) goto LAB_006284cb;
  if ((((uint)(uVar7 >> 0x26) & 1) == 0 && pQVar5->parent != (QGraphicsItem *)0x0) &&
     ((((pQVar5->parent->d_ptr).d)->field_0x164 & 0x80) == 0)) {
    parentOpacity_00 = parentOpacity * pQVar5->opacity;
  }
  else {
    parentOpacity_00 = pQVar5->opacity;
  }
  lVar2 = (pQVar5->children).d.size;
  if (parentOpacity_00 < 0.001) {
    if (lVar2 == 0) goto LAB_006284cb;
    if ((uVar7 >> 0x27 & 1) == 0) {
      lVar6 = 0;
      do {
        if ((*(ulong *)&(((pQVar5->children).d.ptr[lVar6]->d_ptr).d)->field_0x160 & 0x4000000000) !=
            0) goto LAB_006280aa;
        lVar6 = lVar6 + 1;
      } while (lVar2 != lVar6);
      goto LAB_006284cb;
    }
  }
LAB_006280aa:
  uVar8 = uVar7 & 0x20002000040000;
  uVar9 = uVar7;
  if (uVar8 == 0x20000000000000) {
    (*pQVar5->_vptr_QGraphicsItemPrivate[2])();
    uVar9 = *(ulong *)&((item->d_ptr).d)->field_0x160;
  }
  if (0.001 <= parentOpacity_00) {
    bVar4 = (*intersect)(item,&exposeRect,mode,viewTransform,intersectData);
    if ((!bVar4) && (lVar2 == 0 || (uVar9 & 0x8001000000000) != 0)) {
      if ((uVar8 == 0x20000000000000) && (pQVar5 = (item->d_ptr).d, (pQVar5->children).d.size != 0))
      {
        uVar7 = 0;
        do {
          puVar1 = &(((pQVar5->children).d.ptr[uVar7]->d_ptr).d)->field_0x160;
          *(ulong *)puVar1 = *(ulong *)puVar1 | 0x20000000000000;
          uVar7 = uVar7 + 1;
        } while (uVar7 < (ulong)(pQVar5->children).d.size);
      }
      goto LAB_006284cb;
    }
  }
  else {
    bVar4 = false;
  }
  if (lVar2 == 0) {
    uVar7 = 0;
  }
  else {
    QGraphicsItemPrivate::ensureSortedChildren((item->d_ptr).d);
    if (((uVar7 & 0x2000040000) == 0) && ((uVar9 & 0x8001000000000) != 0)) {
      local_60 = &DAT_aaaaaaaaaaaaaaaa;
      if ((((item->d_ptr).d)->field_0x167 & 0x40) == 0) {
        (*item->_vptr_QGraphicsItem[4])(&local_58,item);
        QTransform::map((QPainterPath *)&local_60);
      }
      else {
        (*item->_vptr_QGraphicsItem[4])(&local_58,item);
        pQVar5 = (item->d_ptr).d;
        QPainterPath::translated
                  ((pQVar5->sceneTransform).m_matrix[2][0],(pQVar5->sceneTransform).m_matrix[2][1]);
      }
      QPainterPath::~QPainterPath((QPainterPath *)&local_58);
      QPainterPath::controlPointRect();
      QRectF::operator&(&local_58,&exposeRect);
      exposeRect.w = local_58.w;
      exposeRect.h = local_58.h;
      exposeRect.xp = local_58.xp;
      exposeRect.yp = local_58.yp;
      QPainterPath::~QPainterPath((QPainterPath *)&local_60);
    }
    pQVar5 = (item->d_ptr).d;
    if ((pQVar5->children).d.size == 0) {
      uVar7 = 0;
    }
    else {
      uVar7 = 0;
      do {
        pQVar3 = (pQVar5->children).d.ptr[uVar7];
        if (uVar8 == 0x20000000000000) {
          puVar1 = &((pQVar3->d_ptr).d)->field_0x160;
          *(ulong *)puVar1 = *(ulong *)puVar1 | 0x20000000000000;
        }
        uVar9 = *(ulong *)&((pQVar3->d_ptr).d)->field_0x160;
        if ((uVar9 >> 0x28 & 1) == 0) break;
        if ((0.001 <= parentOpacity_00) || ((uVar9 & 0x4000000000) != 0)) {
          exposeRect_00.yp = exposeRect.yp;
          exposeRect_00.xp = exposeRect.xp;
          exposeRect_00.w = exposeRect.w;
          exposeRect_00.h = exposeRect.h;
          recursive_items_helper
                    (this,pQVar3,exposeRect_00,intersect,items,viewTransform,mode,parentOpacity_00,
                     intersectData);
        }
        uVar7 = uVar7 + 1;
        pQVar5 = (item->d_ptr).d;
      } while (uVar7 < (ulong)(pQVar5->children).d.size);
      uVar7 = uVar7 & 0xffffffff;
    }
  }
  if (bVar4 != false) {
    local_58.xp = (qreal)item;
    QtPrivate::QPodArrayOps<QGraphicsItem*>::emplace<QGraphicsItem*&>
              ((QPodArrayOps<QGraphicsItem*> *)items,(items->d).size,(QGraphicsItem **)&local_58);
    QList<QGraphicsItem_*>::end(items);
  }
  if (lVar2 != 0) {
    for (; pQVar5 = (item->d_ptr).d, uVar7 < (ulong)(pQVar5->children).d.size; uVar7 = uVar7 + 1) {
      pQVar3 = (pQVar5->children).d.ptr[uVar7];
      if (uVar8 == 0x20000000000000) {
        puVar1 = &((pQVar3->d_ptr).d)->field_0x160;
        *(ulong *)puVar1 = *(ulong *)puVar1 | 0x20000000000000;
      }
      if ((0.001 <= parentOpacity_00) ||
         ((*(ulong *)&((pQVar3->d_ptr).d)->field_0x160 & 0x4000000000) != 0)) {
        exposeRect_01.yp = exposeRect.yp;
        exposeRect_01.xp = exposeRect.xp;
        exposeRect_01.w = exposeRect.w;
        exposeRect_01.h = exposeRect.h;
        recursive_items_helper
                  (this,pQVar3,exposeRect_01,intersect,items,viewTransform,mode,parentOpacity_00,
                   intersectData);
      }
    }
  }
LAB_006284cb:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsSceneIndexPrivate::recursive_items_helper(QGraphicsItem *item, QRectF exposeRect,
                                                        QGraphicsSceneIndexIntersector intersect,
                                                        QList<QGraphicsItem *> *items,
                                                        const QTransform &viewTransform,
                                                        Qt::ItemSelectionMode mode,
                                                        qreal parentOpacity, const void *intersectData) const
{
    Q_ASSERT(item);
    if (!item->d_ptr->visible)
        return;

    const qreal opacity = item->d_ptr->combineOpacityFromParent(parentOpacity);
    const bool itemIsFullyTransparent = QGraphicsItemPrivate::isOpacityNull(opacity);
    const bool itemHasChildren = !item->d_ptr->children.isEmpty();
    if (itemIsFullyTransparent && (!itemHasChildren || item->d_ptr->childrenCombineOpacity()))
        return;

    // Update the item's scene transform if dirty.
    const bool itemIsUntransformable = item->d_ptr->itemIsUntransformable();
    const bool wasDirtyParentSceneTransform = item->d_ptr->dirtySceneTransform && !itemIsUntransformable;
    if (wasDirtyParentSceneTransform) {
        item->d_ptr->updateSceneTransformFromParent();
        Q_ASSERT(!item->d_ptr->dirtySceneTransform);
    }

    const bool itemClipsChildrenToShape = (item->d_ptr->flags & QGraphicsItem::ItemClipsChildrenToShape
                                           || item->d_ptr->flags & QGraphicsItem::ItemContainsChildrenInShape);
    bool processItem = !itemIsFullyTransparent;
    if (processItem) {
        processItem = intersect(item, exposeRect, mode, viewTransform, intersectData);
        if (!processItem && (!itemHasChildren || itemClipsChildrenToShape)) {
            if (wasDirtyParentSceneTransform)
                item->d_ptr->invalidateChildrenSceneTransform();
            return;
        }
    } // else we know for sure this item has children we must process.

    int i = 0;
    if (itemHasChildren) {
        // Sort children.
        item->d_ptr->ensureSortedChildren();

        // Clip to shape.
        if (itemClipsChildrenToShape && !itemIsUntransformable) {
            QPainterPath mappedShape = item->d_ptr->sceneTransformTranslateOnly
                                     ? item->shape().translated(item->d_ptr->sceneTransform.dx(),
                                                                item->d_ptr->sceneTransform.dy())
                                     : item->d_ptr->sceneTransform.map(item->shape());
            exposeRect &= mappedShape.controlPointRect();
        }

        // Process children behind
        for (i = 0; i < item->d_ptr->children.size(); ++i) {
            QGraphicsItem *child = item->d_ptr->children.at(i);
            if (wasDirtyParentSceneTransform)
                child->d_ptr->dirtySceneTransform = 1;
            if (!(child->d_ptr->flags & QGraphicsItem::ItemStacksBehindParent))
                break;
            if (itemIsFullyTransparent && !(child->d_ptr->flags & QGraphicsItem::ItemIgnoresParentOpacity))
                continue;
            recursive_items_helper(child, exposeRect, intersect, items, viewTransform,
                                   mode, opacity, intersectData);
        }
    }

    // Process item
    if (processItem)
        items->append(item);

    // Process children in front
    if (itemHasChildren) {
        for (; i < item->d_ptr->children.size(); ++i) {
            QGraphicsItem *child = item->d_ptr->children.at(i);
            if (wasDirtyParentSceneTransform)
                child->d_ptr->dirtySceneTransform = 1;
            if (itemIsFullyTransparent && !(child->d_ptr->flags & QGraphicsItem::ItemIgnoresParentOpacity))
                continue;
            recursive_items_helper(child, exposeRect, intersect, items, viewTransform,
                                   mode, opacity, intersectData);
        }
    }
}